

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ProducerIPCService::CommitData
          (ProducerIPCService *this,CommitDataRequest *req,DeferredCommitDataResponse *resp)

{
  bool bVar1;
  pointer pPVar2;
  function<void_()> local_70;
  anon_class_8_1_899108ce local_50;
  undefined1 local_48 [8];
  function<void_()> callback;
  RemoteProducer *producer;
  DeferredCommitDataResponse *resp_local;
  CommitDataRequest *req_local;
  ProducerIPCService *this_local;
  
  callback._M_invoker = (_Invoker_type)GetProducerForCurrentRequest(this);
  if ((RemoteProducer *)callback._M_invoker == (RemoteProducer *)0x0) {
    perfetto::base::ignore_result<char[60]>
              ((char (*) [60])"Producer invoked CommitData() before InitializeConnection()");
    bVar1 = ipc::DeferredBase::IsBound(&resp->super_DeferredBase);
    if (bVar1) {
      ipc::DeferredBase::Reject(&resp->super_DeferredBase);
    }
  }
  else {
    ::std::function<void_()>::function((function<void_()> *)local_48);
    bVar1 = ipc::DeferredBase::IsBound(&resp->super_DeferredBase);
    if (bVar1) {
      local_50.resp = resp;
      ::std::function<void()>::operator=((function<void()> *)local_48,&local_50);
    }
    pPVar2 = std::
             unique_ptr<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
             ::operator->((unique_ptr<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
                           *)(callback._M_invoker + 8));
    ::std::function<void_()>::function(&local_70,(function<void_()> *)local_48);
    (*pPVar2->_vptr_ProducerEndpoint[7])(pPVar2,req,&local_70);
    ::std::function<void_()>::~function(&local_70);
    ::std::function<void_()>::~function((function<void_()> *)local_48);
  }
  return;
}

Assistant:

void ProducerIPCService::CommitData(const protos::gen::CommitDataRequest& req,
                                    DeferredCommitDataResponse resp) {
  RemoteProducer* producer = GetProducerForCurrentRequest();
  if (!producer) {
    PERFETTO_DLOG(
        "Producer invoked CommitData() before InitializeConnection()");
    if (resp.IsBound())
      resp.Reject();
    return;
  }

  // We don't want to send a response if the client didn't attach a callback to
  // the original request. Doing so would generate unnecessary wakeups and
  // context switches.
  std::function<void()> callback;
  if (resp.IsBound()) {
    // Capturing |resp| by reference here speculates on the fact that
    // CommitData() in tracing_service_impl.cc invokes the passed callback
    // inline, without posting it. If that assumption changes this code needs to
    // wrap the response in a shared_ptr (C+11 lambdas don't support move) and
    // use a weak ptr in the caller.
    callback = [&resp] {
      resp.Resolve(ipc::AsyncResult<protos::gen::CommitDataResponse>::Create());
    };
  }
  producer->service_endpoint->CommitData(req, callback);
}